

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O3

polynomial_t polynomial_create_from_roots(field_t field,uint nroots,field_element_t *roots)

{
  polynomial_t res;
  field_t field_00;
  field_element_t *__dest;
  field_element_t *__ptr;
  field_element_t *__src;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  polynomial_t pVar5;
  polynomial_t l;
  polynomial_t r_00;
  polynomial_t r [2];
  field_element_t *local_98;
  void *local_90 [4];
  ulong local_70;
  field_element_t *local_68;
  ulong local_60;
  field_element_t *local_58;
  field_logarithm_t *local_50;
  void *local_48;
  field_element_t *local_40;
  ulong local_38;
  
  local_50 = field.log;
  local_58 = field.exp;
  uVar2 = (ulong)(nroots + 1);
  __dest = (field_element_t *)malloc(uVar2);
  uVar4 = 1;
  __ptr = (field_element_t *)calloc(2,1);
  __src = (field_element_t *)calloc(uVar2,1);
  local_98 = __src;
  local_48 = calloc(uVar2,1);
  local_90[1] = local_48;
  *__src = *roots;
  __src[1] = '\x01';
  local_90[0]._0_4_ = 1;
  __ptr[1] = '\x01';
  local_40 = __src;
  uVar1 = (ulong)nroots;
  if (1 < nroots) {
    local_70 = uVar2;
    local_68 = __dest;
    local_60 = (ulong)nroots;
    local_38 = (ulong)nroots;
    field_00.log = local_50;
    field_00.exp = local_58;
    uVar1 = 0;
    do {
      *__ptr = roots[uVar4];
      uVar3 = ~(uint)uVar1 & 1;
      uVar4 = uVar4 + 1;
      uVar2 = (ulong)(uVar3 << 4);
      *(int *)((long)local_90 + uVar2) = (int)uVar4;
      res._8_8_ = *(undefined8 *)((long)local_90 + uVar2);
      res.coeff = *(field_element_t **)((long)local_90 + (uVar2 - 8));
      l._8_8_ = 1;
      l.coeff = __ptr;
      r_00.order = *(undefined4 *)(local_90 + uVar1 * 2);
      r_00.coeff = (field_element_t *)local_90[uVar1 * 2 + -1];
      r_00._12_4_ = 0;
      polynomial_mul(field_00,l,r_00,res);
      uVar1 = (ulong)uVar3;
    } while (local_38 != uVar4);
    __src = *(field_element_t **)((long)local_90 + (uVar2 - 8));
    uVar1 = local_60;
    uVar2 = local_70;
    __dest = local_68;
  }
  memcpy(__dest,__src,uVar2);
  free(__ptr);
  free(local_40);
  free(local_48);
  pVar5._8_8_ = uVar1 & 0xffffffff;
  pVar5.coeff = __dest;
  return pVar5;
}

Assistant:

polynomial_t polynomial_create_from_roots(field_t field, unsigned int nroots, field_element_t *roots) {
    polynomial_t poly = polynomial_create(nroots);
    unsigned int order = nroots;
    polynomial_t l;
    l.order = 1;
    l.coeff = calloc(2, sizeof(field_element_t));

    polynomial_t r[2];
    // we'll keep two temporary stores of rightside polynomial
    // each time through the loop, we take the previous result and use it as new rightside
    // swap back and forth (prevents the need for a copy)
    r[0].coeff = calloc(order + 1, sizeof(field_element_t));
    r[1].coeff = calloc(order + 1, sizeof(field_element_t));
    unsigned int rcoeffres = 0;

    // initialize the result with x + roots[0]
    r[rcoeffres].coeff[0] = roots[0];
    r[rcoeffres].coeff[1] = 1;
    r[rcoeffres].order = 1;

    // initialize lcoeff[1] with x
    // we'll fill in the 0th order term in each loop iter
    l.coeff[1] = 1;

    // loop through, using previous run's result as the new right hand side
    // this allows us to multiply one group at a time
    for (unsigned int i = 1; i < nroots; i++) {
        l.coeff[0] = roots[i];
        unsigned int nextrcoeff = rcoeffres;
        rcoeffres = (rcoeffres + 1) % 2;
        r[rcoeffres].order = i + 1;
        polynomial_mul(field, l, r[nextrcoeff], r[rcoeffres]);
    }

    memcpy(poly.coeff, r[rcoeffres].coeff, (order + 1) * sizeof(field_element_t));
    poly.order = order;

    free(l.coeff);
    free(r[0].coeff);
    free(r[1].coeff);

    return poly;
}